

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::Incomplete2DWrapModeCase::createTexture(Incomplete2DWrapModeCase *this)

{
  ostringstream *this_00;
  GLsizei width;
  GLsizei height;
  TextureFormat TVar1;
  bool bVar2;
  GLenum err;
  GLuint texture;
  TextureLevel levelData;
  TextureFormat fmt;
  Vec4 local_1b8;
  undefined1 local_1a0 [32];
  void *local_180;
  ios_base local_128 [264];
  
  TVar1 = (TextureFormat)((this->super_Tex2DCompletenessCase).m_testCtx)->m_log;
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,this->m_wrapS);
  glwTexParameteri(0xde1,0x2803,*(GLint *)&(this->super_Tex2DCompletenessCase).field_0x84);
  glwTexParameteri(0xde1,0x2801,0x2600);
  glwTexParameteri(0xde1,0x2800,0x2600);
  tcu::TextureLevel::setSize(&levelData,(this->m_size).m_data[0],(this->m_size).m_data[1],1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1a0,&levelData);
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 1.0;
  local_1b8.m_data[3] = 1.0;
  tcu::clear((PixelBufferAccess *)local_1a0,&local_1b8);
  width = (this->m_size).m_data[0];
  height = (this->m_size).m_data[1];
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1a0,&levelData);
  glwTexImage2D(0xde1,0,0x1908,width,height,0,0x1908,0x1401,local_180);
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x1d3);
  bVar2 = isExtensionSupported(this->m_ctxInfo,"GL_OES_texture_npot");
  if (bVar2) {
    this_00 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = TVar1;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"GL_OES_texture_npot",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," supported, assuming completeness test to pass.",0x2f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    (this->super_Tex2DCompletenessCase).m_compareColor.m_value = 0xffff0000;
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void Incomplete2DWrapModeCase::createTexture (void)
{
	TestLog&			log			= m_testCtx.getLog();
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures(1, &texture);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	levelData.setSize(m_size.x(), m_size.y());
	clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, m_size.x(), m_size.y(), 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());

	GLU_CHECK_MSG("Set texturing state");

	const char* extension = "GL_OES_texture_npot";
	if (isExtensionSupported(m_ctxInfo, extension))
	{
		log << TestLog::Message << extension << " supported, assuming completeness test to pass." << TestLog::EndMessage;
		m_compareColor = RGBA(0,0,255,255);
	}
}